

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLoadStore
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  uint uVar1;
  string *psVar2;
  undefined4 in_register_0000000c;
  uint in_R8D;
  initializer_list<AssemblyTemplateArgument> variables;
  AssemblyTemplateArgument *local_250;
  string *local_210;
  char *local_1e8;
  char *local_1c8;
  allocator<char> local_190;
  byte local_18f;
  allocator<char> local_18e;
  allocator<char> local_18d [20];
  allocator<char> local_179;
  AssemblyTemplateArgument *local_178;
  AssemblyTemplateArgument local_170;
  char *local_148;
  string asStack_140 [32];
  char *local_120;
  string asStack_118 [32];
  char *local_f8;
  string asStack_f0 [32];
  char *local_d0;
  string local_c8;
  char *local_a8;
  string local_a0 [32];
  undefined1 local_80 [24];
  undefined1 local_68 [7];
  bool store;
  string macroText;
  char *pcStack_40;
  bool isCop;
  char *op;
  char *templateLoadStore;
  int flags_local;
  MipsImmediateData *immediates_local;
  MipsRegisterData *registers_local;
  Parser *parser_local;
  
  macroText.field_2._M_local_buf[0xf] = '\0';
  uVar1 = in_R8D & 0x3000f;
  if (uVar1 == 0x10001) {
    pcStack_40 = "lb";
  }
  else if (uVar1 == 0x10002) {
    pcStack_40 = "lbu";
  }
  else if (uVar1 == 0x10003) {
    pcStack_40 = "lh";
  }
  else if (uVar1 == 0x10004) {
    pcStack_40 = "lhu";
  }
  else if (uVar1 == 0x10005) {
    pcStack_40 = "lw";
  }
  else if (uVar1 == 0x10006) {
    pcStack_40 = "lwu";
  }
  else if (uVar1 == 0x10007) {
    pcStack_40 = "ld";
  }
  else if (uVar1 == 0x10008) {
    pcStack_40 = "ll";
  }
  else if (uVar1 == 0x10009) {
    pcStack_40 = "lld";
  }
  else if (uVar1 == 0x1000a) {
    pcStack_40 = "lwc1";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  else if (uVar1 == 0x1000b) {
    pcStack_40 = "lwc2";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  else if (uVar1 == 0x1000c) {
    pcStack_40 = "ldc1";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  else if (uVar1 == 0x1000d) {
    pcStack_40 = "ldc2";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  else if (uVar1 == 0x20001) {
    pcStack_40 = "sb";
  }
  else if (uVar1 == 0x20003) {
    pcStack_40 = "sh";
  }
  else if (uVar1 == 0x20005) {
    pcStack_40 = "sw";
  }
  else if (uVar1 == 0x20007) {
    pcStack_40 = "sd";
  }
  else if (uVar1 == 0x20008) {
    pcStack_40 = "sc";
  }
  else if (uVar1 == 0x20009) {
    pcStack_40 = "scd";
  }
  else if (uVar1 == 0x2000a) {
    pcStack_40 = "swc1";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  else if (uVar1 == 0x2000b) {
    pcStack_40 = "swc2";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  else if (uVar1 == 0x2000c) {
    pcStack_40 = "sdc1";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  else {
    if (uVar1 != 0x2000d) {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )parser;
    }
    pcStack_40 = "sdc2";
    macroText.field_2._M_local_buf[0xf] = '\x01';
  }
  preprocessMacro_abi_cxx11_
            ((string *)local_68,
             "\n\t\t.if %imm% & ~0xFFFFFFFF\n\t\t\t.error \"Address too big\"\n\t\t.elseif %imm% < 0x8000 || (%imm% & 0xFFFF8000) == 0xFFFF8000\n\t\t\t.if %lower%\n\t\t\t\t%op%\t%rs%, lo(%imm%)(r0)\n\t\t\t.elseif %upper%\n\t\t\t\tnop\n\t\t\t.endif\n\t\t.else\n\t\t\t.if %upper%\n\t\t\t\tlui\t\t%temp%, hi(%imm%)\n\t\t\t.endif\n\t\t\t.if %lower%\n\t\t\t\t%op%\t%rs%, lo(%imm%)(%temp%)\n\t\t\t.endif\n\t\t.endif\n\t"
             ,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_80[0x17] = (in_R8D & 0x20000) != 0;
  local_178 = &local_170;
  local_170.variableName = "%upper%";
  if ((in_R8D & 0x4000) == 0) {
    local_1c8 = "0";
  }
  else {
    local_1c8 = "1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170.value,local_1c8,&local_179);
  local_178 = (AssemblyTemplateArgument *)&local_148;
  local_148 = "%lower%";
  if ((in_R8D & 0x8000) == 0) {
    local_1e8 = "0";
  }
  else {
    local_1e8 = "1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_140,local_1e8,local_18d);
  local_178 = (AssemblyTemplateArgument *)&local_120;
  local_120 = "%rs%";
  if ((macroText.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_210 = Identifier::string_abi_cxx11_((Identifier *)&(immediates->primary).expression);
  }
  else {
    local_210 = Identifier::string_abi_cxx11_((Identifier *)&immediates[1].secondary.value);
  }
  std::__cxx11::string::string(asStack_118,(string *)local_210);
  local_178 = (AssemblyTemplateArgument *)&local_f8;
  local_f8 = "%temp%";
  local_18f = 0;
  if (((macroText.field_2._M_local_buf[0xf] & 1U) == 0) && ((local_80[0x17] & 1) == 0)) {
    psVar2 = Identifier::string_abi_cxx11_((Identifier *)&(immediates->primary).expression);
    std::__cxx11::string::string(asStack_f0,(string *)psVar2);
  }
  else {
    std::allocator<char>::allocator();
    local_18f = 1;
    std::__cxx11::string::string<std::allocator<char>>(asStack_f0,"r1",&local_18e);
  }
  local_178 = (AssemblyTemplateArgument *)&local_d0;
  local_d0 = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_c8,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  local_178 = (AssemblyTemplateArgument *)&local_a8;
  local_a8 = "%op%";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,pcStack_40,&local_190);
  variables._M_array = (iterator)(ulong)in_R8D;
  local_80._0_8_ = &local_170;
  local_80._8_8_ = 6;
  variables._M_len = local_80._0_8_;
  createMacro(parser,(string *)registers,(int)local_68,variables);
  local_250 = (AssemblyTemplateArgument *)local_80;
  do {
    local_250 = local_250 + -1;
    AssemblyTemplateArgument::~AssemblyTemplateArgument(local_250);
  } while (local_250 != &local_170);
  std::allocator<char>::~allocator(&local_190);
  if ((local_18f & 1) != 0) {
    std::allocator<char>::~allocator(&local_18e);
  }
  std::allocator<char>::~allocator(local_18d);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string((string *)local_68);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLoadStore(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLoadStore = R"(
		.if %imm% & ~0xFFFFFFFF
			.error "Address too big"
		.elseif %imm% < 0x8000 || (%imm% & 0xFFFF8000) == 0xFFFF8000
			.if %lower%
				%op%	%rs%, lo(%imm%)(r0)
			.elseif %upper%
				nop
			.endif
		.else
			.if %upper%
				lui		%temp%, hi(%imm%)
			.endif
			.if %lower%
				%op%	%rs%, lo(%imm%)(%temp%)
			.endif
		.endif
	)";

	const char* op;
	bool isCop = false;
	switch (flags & (MIPSM_ACCESSMASK|MIPSM_LOAD|MIPSM_STORE))
	{
	case MIPSM_LOAD|MIPSM_B:		op = "lb"; break;
	case MIPSM_LOAD|MIPSM_BU:		op = "lbu"; break;
	case MIPSM_LOAD|MIPSM_HW:		op = "lh"; break;
	case MIPSM_LOAD|MIPSM_HWU:		op = "lhu"; break;
	case MIPSM_LOAD|MIPSM_W:		op = "lw"; break;
	case MIPSM_LOAD|MIPSM_WU:		op = "lwu"; break;
	case MIPSM_LOAD|MIPSM_DW:		op = "ld"; break;
	case MIPSM_LOAD|MIPSM_LLSCW:	op = "ll"; break;
	case MIPSM_LOAD|MIPSM_LLSCDW:	op = "lld"; break;
	case MIPSM_LOAD|MIPSM_COP1:		op = "lwc1"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_COP2:		op = "lwc2"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_DCOP1:	op = "ldc1"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_DCOP2:	op = "ldc2"; isCop = true; break;
	case MIPSM_STORE|MIPSM_B:		op = "sb"; break;
	case MIPSM_STORE|MIPSM_HW:		op = "sh"; break;
	case MIPSM_STORE|MIPSM_W:		op = "sw"; break;
	case MIPSM_STORE|MIPSM_DW:		op = "sd"; break;
	case MIPSM_STORE|MIPSM_LLSCW:	op = "sc"; break;
	case MIPSM_STORE|MIPSM_LLSCDW:	op = "scd"; break;
	case MIPSM_STORE|MIPSM_COP1:	op = "swc1"; isCop = true; break;
	case MIPSM_STORE|MIPSM_COP2:	op = "swc2"; isCop = true; break;
	case MIPSM_STORE|MIPSM_DCOP1:	op = "sdc1"; isCop = true; break;
	case MIPSM_STORE|MIPSM_DCOP2:	op = "sdc2"; isCop = true; break;
	default: return nullptr;
	}

	std::string macroText = preprocessMacro(templateLoadStore,immediates);

	bool store = (flags & MIPSM_STORE) != 0;
	return createMacro(parser,macroText,flags, {
			{ "%upper%",	(flags & MIPSM_UPPER) ? "1" : "0" },
			{ "%lower%",	(flags & MIPSM_LOWER) ? "1" : "0" },
			{ "%rs%",		isCop ? registers.frs.name.string() : registers.grs.name.string() },
			{ "%temp%",	isCop || store ? "r1" : registers.grs.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
			{ "%op%",		op },
	});
}